

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Value_Input.cxx
# Opt level: O2

void __thiscall Fl_Value_Input::draw(Fl_Value_Input *this)

{
  Fl_Color FVar1;
  
  if (1 < (this->super_Fl_Valuator).super_Fl_Widget.damage_) {
    (this->input).super_Fl_Input_.super_Fl_Widget.damage_ = 0x80;
  }
  (this->input).super_Fl_Input_.super_Fl_Widget.box_ =
       (this->super_Fl_Valuator).super_Fl_Widget.box_;
  FVar1 = (this->super_Fl_Valuator).super_Fl_Widget.color2_;
  (this->input).super_Fl_Input_.super_Fl_Widget.color_ =
       (this->super_Fl_Valuator).super_Fl_Widget.color_;
  (this->input).super_Fl_Input_.super_Fl_Widget.color2_ = FVar1;
  (*(this->input).super_Fl_Input_.super_Fl_Widget._vptr_Fl_Widget[2])(&this->input);
  (this->input).super_Fl_Input_.super_Fl_Widget.damage_ = '\0';
  return;
}

Assistant:

void Fl_Value_Input::draw() {
  if (damage()&~FL_DAMAGE_CHILD) input.clear_damage(FL_DAMAGE_ALL);
  input.box(box());
  input.color(color(), selection_color());
  Fl_Widget *i = &input; i->draw(); // calls protected input.draw()
  input.clear_damage();
}